

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall CS248::DynamicScene::Scene::subdivideSelection(Scene *this,bool useCatmullClark)

{
  SceneObject *pSVar1;
  
  pSVar1 = (this->selected).object;
  if (pSVar1 != (SceneObject *)0x0) {
    pSVar1 = (SceneObject *)__dynamic_cast(pSVar1,&SceneObject::typeinfo,&Mesh::typeinfo,0);
    if (pSVar1 != (SceneObject *)0x0) {
      HalfedgeMesh::subdivideQuad((HalfedgeMesh *)(pSVar1 + 1),useCatmullClark);
      clearSelections(this);
      (this->selected).object = pSVar1;
      (this->selected).element = (HalfedgeElement *)((long)pSVar1[1].position.y + 0x10);
    }
  }
  return;
}

Assistant:

void Scene::subdivideSelection(bool useCatmullClark) {
  if (selected.object == nullptr) return;

  Mesh *mesh = dynamic_cast<Mesh *>(selected.object);
  if (mesh) {
    mesh->mesh.subdivideQuad(useCatmullClark);

    // Old elements are invalid
    clearSelections();

    // Select the subdivided mesh again, so that we can keep hitting
    // the same key to get multiple subdivisions (without having to
    // click on a mesh element).
    selected.object = mesh;
    selected.element = elementAddress(mesh->mesh.verticesBegin());
  }
}